

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

void __thiscall S2Builder::EdgeChainSimplifier::Run(EdgeChainSimplifier *this)

{
  pointer *pppVar1;
  ulong *puVar2;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *this_00;
  vector<int,std::allocator<int>> *this_01;
  int iVar3;
  _Bit_type *p_Var4;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar5;
  iterator iVar6;
  iterator iVar7;
  bool bVar8;
  Graph *pGVar9;
  pointer ppVar10;
  int iVar11;
  pair<int,_int> *__args;
  int *piVar12;
  uint v;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  _Bit_type _Var17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int local_48;
  int local_44;
  vector<int,_std::allocator<int>_> *local_40;
  vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *local_38;
  
  pGVar9 = this->g_;
  if (0 < pGVar9->num_vertices_) {
    v = 0;
    do {
      bVar8 = IsInterior(this,v);
      p_Var4 = (this->is_interior_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar13 = v >> 6;
      uVar16 = 1L << ((byte)v & 0x3f);
      if (bVar8) {
        _Var17 = uVar16 | p_Var4[uVar13];
      }
      else {
        _Var17 = ~uVar16 & p_Var4[uVar13];
      }
      p_Var4[uVar13] = _Var17;
      v = v + 1;
      pGVar9 = this->g_;
    } while ((int)v < pGVar9->num_vertices_);
  }
  ppVar10 = (pGVar9->edges_->
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(pGVar9->edges_->
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10) >> 3)) {
    local_38 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->new_edges_;
    local_40 = &this->new_input_edge_ids_;
    uVar16 = 0;
    do {
      uVar18 = uVar16 >> 6 & 0x3ffffff;
      if (((this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
           ._M_start.super__Bit_iterator_base._M_p[uVar18] >> (uVar16 & 0x3f) & 1) == 0) {
        iVar11 = ppVar10[uVar16].first;
        uVar14 = (ulong)iVar11;
        iVar3 = iVar11 + 0x3f;
        if (-1 < (long)uVar14) {
          iVar3 = iVar11;
        }
        p_Var4 = (this->is_interior_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        if ((p_Var4[(long)(iVar3 >> 6) +
                    (ulong)((uVar14 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff
                   ] >> (uVar14 & 0x3f) & 1) == 0) {
          iVar3 = ppVar10[uVar16].second;
          iVar15 = iVar3 + 0x3f;
          if (-1 < iVar3) {
            iVar15 = iVar3;
          }
          if ((p_Var4[(long)(iVar15 >> 6) +
                      (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) +
                      0xffffffffffffffff] >> ((long)iVar3 & 0x3fU) & 1) == 0) {
            iVar6._M_current =
                 (this->new_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (this->new_edges_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>const&>(local_38,iVar6,ppVar10 + uVar16);
            }
            else {
              *iVar6._M_current = ppVar10[uVar16];
              pppVar1 = &(this->new_edges_).
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
            local_48 = (this->g_->input_edge_id_set_ids_->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar16];
            iVar7._M_current =
                 (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_40,iVar7,&local_48);
            }
            else {
              *iVar7._M_current = local_48;
              (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            piVar12 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar16;
            iVar7._M_current =
                 (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->new_edge_layers_,iVar7,piVar12);
            }
            else {
              *iVar7._M_current = *piVar12;
              (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            puVar2 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + uVar18;
            *puVar2 = *puVar2 | 1L << ((byte)uVar16 & 0x3f);
          }
          else {
            SimplifyChain(this,iVar11,iVar3);
          }
        }
      }
      uVar16 = uVar16 + 1;
      pvVar5 = this->g_->edges_;
      ppVar10 = (pvVar5->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      iVar11 = (int)((ulong)((long)(pvVar5->
                                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10) >> 3
                    );
    } while ((long)uVar16 < (long)iVar11);
    if (0 < iVar11) {
      uVar16 = 0;
      do {
        uVar18 = uVar16 >> 6 & 0x3ffffff;
        if (((this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar18] >>
             (uVar16 & 0x3f) & 1) == 0) {
          if (ppVar10[uVar16].first == ppVar10[uVar16].second) {
            iVar6._M_current =
                 (this->new_edges_).
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                (this->new_edges_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>const&>(local_38,iVar6,ppVar10 + uVar16);
            }
            else {
              *iVar6._M_current = ppVar10[uVar16];
              pppVar1 = &(this->new_edges_).
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
            local_44 = (this->g_->input_edge_id_set_ids_->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar16];
            iVar7._M_current =
                 (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (local_40,iVar7,&local_44);
            }
            else {
              *iVar7._M_current = local_44;
              (this->new_input_edge_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            piVar12 = (this->edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar16;
            iVar7._M_current =
                 (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->new_edge_layers_,iVar7,piVar12);
            }
            else {
              *iVar7._M_current = *piVar12;
              (this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar7._M_current + 1;
            }
            puVar2 = (this->used_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + uVar18;
            *puVar2 = *puVar2 | 1L << ((byte)uVar16 & 0x3f);
          }
          else {
            SimplifyChain(this,ppVar10[uVar16].first,ppVar10[uVar16].second);
          }
        }
        uVar16 = uVar16 + 1;
        pvVar5 = this->g_->edges_;
        ppVar10 = (pvVar5->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      } while ((long)uVar16 <
               (long)(int)((ulong)((long)(pvVar5->
                                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10
                                  ) >> 3));
    }
  }
  ppVar10 = (this->new_edges_).
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->new_edges_).
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar10) {
    lVar19 = 0;
    lVar20 = 0;
    uVar16 = 0;
    do {
      iVar11 = *(int *)((long)(this->new_edge_layers_).super__Vector_base<int,_std::allocator<int>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar20);
      this_00 = (vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                ((this->layer_edges_->
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + iVar11);
      __args = (pair<int,_int> *)((long)&ppVar10->first + lVar19);
      iVar6._M_current = *(pair<int,_int> **)(this_00 + 8);
      if (iVar6._M_current == *(pair<int,_int> **)(this_00 + 0x10)) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>const&>(this_00,iVar6,__args);
      }
      else {
        *iVar6._M_current = *__args;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
      this_01 = (vector<int,std::allocator<int>> *)
                ((this->layer_input_edge_ids_->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + iVar11);
      piVar12 = (int *)((long)(this->new_input_edge_ids_).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar20);
      iVar7._M_current = *(int **)(this_01 + 8);
      if (iVar7._M_current == *(int **)(this_01 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this_01,iVar7,piVar12);
      }
      else {
        *iVar7._M_current = *piVar12;
        *(int **)(this_01 + 8) = iVar7._M_current + 1;
      }
      uVar16 = uVar16 + 1;
      ppVar10 = (this->new_edges_).
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 4;
      lVar19 = lVar19 + 8;
    } while (uVar16 < (ulong)((long)(this->new_edges_).
                                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar10 >> 3)
            );
  }
  return;
}

Assistant:

void S2Builder::EdgeChainSimplifier::Run() {
  // Determine which vertices can be interior vertices of an edge chain.
  for (VertexId v = 0; v < g_.num_vertices(); ++v) {
    is_interior_[v] = IsInterior(v);
  }
  // Attempt to simplify all edge chains that start from a non-interior
  // vertex.  (This takes care of all chains except loops.)
  for (EdgeId e = 0; e < g_.num_edges(); ++e) {
    if (used_[e]) continue;
    Edge edge = g_.edge(e);
    if (is_interior_[edge.first]) continue;
    if (!is_interior_[edge.second]) {
      OutputEdge(e);  // An edge between two non-interior vertices.
    } else {
      SimplifyChain(edge.first, edge.second);
    }
  }
  // If there are any edges left, they form one or more disjoint loops where
  // all vertices are interior vertices.
  //
  // TODO(ericv): It would be better to start from the edge with the smallest
  // min_input_edge_id(), since that would make the output more predictable
  // for testing purposes.  It also means that we won't create an edge that
  // spans the start and end of a polyline if the polyline is snapped into a
  // loop.  (Unfortunately there are pathological examples that prevent us
  // from guaranteeing this in general, e.g. there could be two polylines in
  // different layers that snap to the same loop but start at different
  // positions.  In general we only consider input edge ids to be a hint
  // towards the preferred output ordering.)
  for (EdgeId e = 0; e < g_.num_edges(); ++e) {
    if (used_[e]) continue;
    Edge edge = g_.edge(e);
    if (edge.first == edge.second) {
      // Note that it is safe to output degenerate edges as we go along,
      // because this vertex has at least one non-degenerate outgoing edge and
      // therefore we will (or just did) start an edge chain here.
      OutputEdge(e);
    } else {
      SimplifyChain(edge.first, edge.second);
    }
  }

  // Finally, copy the output edges into the appropriate layers.  They don't
  // need to be sorted because the input edges were also unsorted.
  for (int e = 0; e < new_edges_.size(); ++e) {
    int layer = new_edge_layers_[e];
    (*layer_edges_)[layer].push_back(new_edges_[e]);
    (*layer_input_edge_ids_)[layer].push_back(new_input_edge_ids_[e]);
  }
}